

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_parameter_validation.cpp
# Opt level: O1

ze_result_t __thiscall
validation_layer::ZESParameterValidation::zesSchedulerSetTimesliceModePrologue
          (ZESParameterValidation *this,zes_sched_handle_t hScheduler,
          zes_sched_timeslice_properties_t *pProperties,ze_bool_t *pNeedReload)

{
  ze_result_t zVar1;
  ze_result_t zVar2;
  
  zVar2 = ZE_RESULT_SUCCESS;
  if (pNeedReload == (ze_bool_t *)0x0) {
    zVar2 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  if (pProperties == (zes_sched_timeslice_properties_t *)0x0) {
    zVar2 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  zVar1 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  if (hScheduler != (zes_sched_handle_t)0x0) {
    zVar1 = zVar2;
  }
  return zVar1;
}

Assistant:

ze_result_t
    ZESParameterValidation::zesSchedulerSetTimesliceModePrologue(
        zes_sched_handle_t hScheduler,                  ///< [in] Sysman handle for the component.
        zes_sched_timeslice_properties_t* pProperties,  ///< [in] The properties to use when configurating this mode.
        ze_bool_t* pNeedReload                          ///< [in,out] Will be set to TRUE if a device driver reload is needed to
                                                        ///< apply the new scheduler mode.
        )
    {
        if( nullptr == hScheduler )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == pProperties )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == pNeedReload )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        return ParameterValidation::validateExtensions(pProperties);
    }